

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_iface.hpp
# Opt level: O0

void __thiscall Args::GroupIface::addArg(GroupIface *this,ArgPtr *arg)

{
  bool bVar1;
  const_iterator __first;
  CmdLine *pCVar2;
  vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
  *in_RSI;
  ArgIface *in_RDI;
  pointer in_stack_ffffffffffffffb8;
  __normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
  in_stack_ffffffffffffffd0;
  
  std::
  vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
  ::cbegin((vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
            *)in_stack_ffffffffffffffb8);
  __first = std::
            vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
            ::cend((vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
                    *)in_stack_ffffffffffffffb8);
  std::
  find<__gnu_cxx::__normal_iterator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>const*,std::vector<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,std::allocator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>>>,std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>
            ((__normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
              )__first._M_current,in_stack_ffffffffffffffd0,
             (unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)in_RDI);
  std::
  vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
  ::cend((vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
          *)in_stack_ffffffffffffffb8);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
                      *)in_RSI,
                     (__normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
                      *)in_stack_ffffffffffffffb8);
  if (bVar1) {
    pCVar2 = ArgIface::cmdLine(in_RDI);
    if (pCVar2 != (CmdLine *)0x0) {
      in_stack_ffffffffffffffb8 =
           std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::operator->
                     ((unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)
                      0x13c729);
      pCVar2 = ArgIface::cmdLine(in_RDI);
      (*in_stack_ffffffffffffffb8->_vptr_ArgIface[0x12])(in_stack_ffffffffffffffb8,pCVar2);
    }
    std::
    vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
    ::push_back(in_RSI,(value_type *)in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

virtual void addArg( ArgPtr arg )
	{
		if( std::find( m_children.cbegin(), m_children.cend(), arg ) ==
			m_children.cend() )
		{
			if( cmdLine() )
				arg->setCmdLine( cmdLine() );

			m_children.push_back( std::move( arg ) );
		}
	}